

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

void __thiscall Assimp::D3MF::XmlSerializer::ImportXml(XmlSerializer *this,aiScene *scene)

{
  pointer pMVar1;
  pointer pMVar2;
  ulong uVar3;
  pointer __src;
  pointer __src_00;
  char *pcVar4;
  void *__src_01;
  void *pvVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  aiNode *paVar9;
  undefined4 extraout_var;
  ulong uVar10;
  aiMetadata *paVar11;
  aiString *paVar12;
  aiMetadataEntry *__s;
  undefined4 *puVar13;
  aiMesh **__s_00;
  aiMaterial **__dest;
  aiNode **__s_01;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  aiString *paVar17;
  ulong uVar18;
  string nodeName;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  aiString val;
  undefined1 *local_480;
  char *local_478;
  undefined1 local_470;
  undefined7 uStack_46f;
  aiMetadata *local_460;
  void *local_458;
  void *pvStack_450;
  long local_448;
  aiString *local_440;
  undefined8 local_438;
  
  if (scene == (aiScene *)0x0) {
    return;
  }
  paVar9 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar9);
  scene->mRootNode = paVar9;
  local_448 = 0;
  local_458 = (void *)0x0;
  pvStack_450 = (void *)0x0;
  local_480 = &local_470;
  local_478 = (char *)0x0;
  local_470 = 0;
  while (bVar6 = ReadToEndElement(this,(string *)XmlTag::model_abi_cxx11_), bVar6) {
    iVar7 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    pcVar4 = local_478;
    strlen((char *)CONCAT44(extraout_var,iVar7));
    std::__cxx11::string::_M_replace((ulong)&local_480,0,pcVar4,CONCAT44(extraout_var,iVar7));
    pcVar4 = local_478;
    if ((local_478 == _DAT_008d1ed0) &&
       ((local_478 == (char *)0x0 ||
        (iVar7 = bcmp(local_480,XmlTag::object_abi_cxx11_,(size_t)local_478), iVar7 == 0)))) {
      local_438 = ReadObject(this,scene);
      std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                ((vector<aiNode*,std::allocator<aiNode*>> *)&local_458,(aiNode **)&local_438);
    }
    else if ((pcVar4 != DAT_008d20f0) ||
            ((pcVar4 != (char *)0x0 &&
             (iVar7 = bcmp(local_480,XmlTag::build_abi_cxx11_,(size_t)pcVar4), iVar7 != 0)))) {
      if ((pcVar4 == DAT_008d2170) &&
         ((pcVar4 == (char *)0x0 ||
          (iVar7 = bcmp(local_480,XmlTag::basematerials_abi_cxx11_,(size_t)pcVar4), iVar7 == 0)))) {
        ReadBaseMaterials(this);
      }
      else if ((pcVar4 == DAT_008d1e10) &&
              ((pcVar4 == (char *)0x0 ||
               (iVar7 = bcmp(local_480,XmlTag::meta_abi_cxx11_,(size_t)pcVar4), iVar7 == 0)))) {
        ReadMetadata(this);
      }
    }
  }
  paVar9 = scene->mRootNode;
  if ((paVar9->mName).length == 0) {
    (paVar9->mName).length = 3;
    builtin_strncpy((paVar9->mName).data,"3MF",4);
  }
  pMVar1 = (this->mMetaData).
           super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (this->mMetaData).
           super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar2) {
    uVar10 = (long)pMVar2 - (long)pMVar1 >> 6;
    if ((uint)uVar10 == 0) {
      paVar11 = (aiMetadata *)0x0;
    }
    else {
      paVar11 = (aiMetadata *)operator_new(0x18);
      paVar11->mKeys = (aiString *)0x0;
      paVar11->mValues = (aiMetadataEntry *)0x0;
      paVar11->mNumProperties = (uint)uVar10;
      paVar12 = (aiString *)operator_new__((uVar10 & 0xffffffff) * 0x404);
      paVar17 = paVar12;
      do {
        paVar17->length = 0;
        paVar17->data[0] = '\0';
        memset(paVar17->data + 1,0x1b,0x3ff);
        paVar17 = paVar17 + 1;
      } while (paVar17 != paVar12 + (uVar10 & 0xffffffff));
      paVar11->mKeys = paVar12;
      uVar15 = (ulong)paVar11->mNumProperties << 4;
      __s = (aiMetadataEntry *)operator_new__(uVar15);
      memset(__s,0,uVar15);
      paVar11->mValues = __s;
    }
    scene->mMetaData = paVar11;
    if (pMVar2 != pMVar1) {
      lVar14 = 0x28;
      uVar15 = 0;
      do {
        pMVar1 = (this->mMetaData).
                 super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar3 = *(ulong *)((long)&(pMVar1->name)._M_dataplus._M_p + lVar14);
        sVar16 = uVar3 & 0xffffffff;
        if ((uVar3 & 0xfffffc00) != 0) {
          sVar16 = 0x3ff;
        }
        local_438 = (aiNode *)CONCAT44(local_438._4_4_,(uint)sVar16);
        memcpy((void *)((long)&local_438 + 4),*(void **)((long)pMVar1 + lVar14 + -8),sVar16);
        *(undefined1 *)((long)&local_438 + sVar16 + 4) = 0;
        paVar11 = scene->mMetaData;
        if (((uint)uVar15 < paVar11->mNumProperties) &&
           (uVar3 = *(ulong *)((long)pMVar1 + lVar14 + -0x20), uVar3 != 0)) {
          uVar18 = uVar15 & 0xffffffff;
          if (uVar3 < 0x400) {
            local_440 = paVar11->mKeys + uVar18;
            paVar17 = paVar11->mKeys + uVar18;
            paVar17->length = (ai_uint32)uVar3;
            local_460 = paVar11;
            memcpy(paVar17->data,*(void **)((long)pMVar1 + lVar14 + -0x28),uVar3);
            local_440->data[uVar3] = '\0';
            paVar11 = local_460;
          }
          paVar11->mValues[uVar18].mType = AI_AISTRING;
          puVar13 = (undefined4 *)operator_new(0x404);
          if (0x3fe < (uint)sVar16) {
            sVar16 = 0x3ff;
          }
          *puVar13 = (int)sVar16;
          memcpy(puVar13 + 1,(void *)((long)&local_438 + 4),sVar16);
          *(undefined1 *)((long)puVar13 + sVar16 + 4) = 0;
          paVar11->mValues[uVar18].mData = puVar13;
        }
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 0x40;
      } while (uVar10 + (uVar10 == 0) != uVar15);
    }
  }
  uVar10 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  scene->mNumMeshes = (uint)(uVar10 >> 3);
  uVar10 = uVar10 & 0x7fffffff8;
  __s_00 = (aiMesh **)operator_new__(uVar10);
  memset(__s_00,0,uVar10);
  scene->mMeshes = __s_00;
  __src = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  sVar16 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)__src;
  if (sVar16 != 0) {
    memmove(__s_00,__src,sVar16);
  }
  uVar10 = (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)(uVar10 >> 3);
  scene->mNumMaterials = uVar8;
  if (uVar8 != 0) {
    __dest = (aiMaterial **)operator_new__(uVar10 & 0x7fffffff8);
    scene->mMaterials = __dest;
    __src_00 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    sVar16 = (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)__src_00;
    if (sVar16 != 0) {
      memmove(__dest,__src_00,sVar16);
    }
  }
  pvVar5 = pvStack_450;
  __src_01 = local_458;
  uVar15 = (long)pvStack_450 - (long)local_458;
  scene->mRootNode->mNumChildren = (uint)(uVar15 >> 3);
  paVar9 = scene->mRootNode;
  uVar10 = (ulong)paVar9->mNumChildren << 3;
  __s_01 = (aiNode **)operator_new__(uVar10);
  memset(__s_01,0,uVar10);
  paVar9->mChildren = __s_01;
  if (pvVar5 != __src_01) {
    memmove(scene->mRootNode->mChildren,__src_01,uVar15);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480,CONCAT71(uStack_46f,local_470) + 1);
  }
  if (local_458 == (void *)0x0) {
    return;
  }
  operator_delete(local_458,local_448 - (long)local_458);
  return;
}

Assistant:

void ImportXml(aiScene* scene) {
        if ( nullptr == scene ) {
            return;
        }

        scene->mRootNode = new aiNode();
        std::vector<aiNode*> children;

        std::string nodeName;
        while(ReadToEndElement(D3MF::XmlTag::model)) {
            nodeName = xmlReader->getNodeName();
            if( nodeName == D3MF::XmlTag::object) {
                children.push_back(ReadObject(scene));
            } else if( nodeName == D3MF::XmlTag::build) {
                // 
            } else if ( nodeName == D3MF::XmlTag::basematerials ) {
                ReadBaseMaterials();
            } else if ( nodeName == D3MF::XmlTag::meta ) {
                ReadMetadata();
            }
        }

        if ( scene->mRootNode->mName.length == 0 ) {
            scene->mRootNode->mName.Set( "3MF" );
        }

        // import the metadata
        if ( !mMetaData.empty() ) {
            const size_t numMeta( mMetaData.size() );
            scene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>( numMeta ) );
            for ( size_t i = 0; i < numMeta; ++i ) {
                aiString val( mMetaData[ i ].value );
                scene->mMetaData->Set(static_cast<unsigned int>( i ), mMetaData[ i ].name, val );
            }
        }

        // import the meshes
        scene->mNumMeshes = static_cast<unsigned int>( mMeshes.size());
        scene->mMeshes = new aiMesh*[scene->mNumMeshes]();
        std::copy( mMeshes.begin(), mMeshes.end(), scene->mMeshes);

        // import the materials
        scene->mNumMaterials = static_cast<unsigned int>( mMatArray.size() );
        if ( 0 != scene->mNumMaterials ) {
            scene->mMaterials = new aiMaterial*[ scene->mNumMaterials ];
            std::copy( mMatArray.begin(), mMatArray.end(), scene->mMaterials );
        }

        // create the scenegraph
        scene->mRootNode->mNumChildren = static_cast<unsigned int>(children.size());
        scene->mRootNode->mChildren = new aiNode*[scene->mRootNode->mNumChildren]();
        std::copy(children.begin(), children.end(), scene->mRootNode->mChildren);
    }